

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

x86_reg X86_insn_reg_att(uint id,cs_ac_type *access)

{
  long lVar1;
  
  lVar1 = 4;
  do {
    if (*(ushort *)((long)&insn_regs_intel2[7].access2 + lVar1) == id) {
      if (access != (cs_ac_type *)0x0) {
        *access = CS_AC_INVALID;
      }
      return *(x86_reg *)((long)&insn_regs_att[0].insn + lVar1);
    }
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x4cc);
  return X86_REG_INVALID;
}

Assistant:

x86_reg X86_insn_reg_att(unsigned int id, enum cs_ac_type *access)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_att); i++) {
		if (insn_regs_att[i].insn == id) {
			if (access)
				*access = insn_regs_att[i].access;
			return insn_regs_att[i].reg;
		}
	}

	// not found
	return 0;
}